

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

void __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::push_back
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this)

{
  iterator __position;
  StatusInfo local_c;
  
  local_c.status_ = 0;
  __position._M_current =
       (this->data_).
       super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->data_).
      super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
    ::_M_realloc_insert<OpenMesh::Attributes::StatusInfo>(&this->data_,__position,&local_c);
  }
  else {
    (__position._M_current)->status_ = 0;
    (this->data_).
    super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }